

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O1

void pair1_sock_init_impl(void *arg,nni_sock *sock,_Bool raw)

{
  nni_stat_item *item;
  nni_stat_item *item_00;
  undefined3 in_register_00000011;
  
  nni_mtx_init((nni_mtx *)((long)arg + 0x20));
  *(nni_sock **)arg = sock;
  *(_Bool *)((long)arg + 8) = raw;
  nni_lmq_init((nni_lmq *)((long)arg + 0xa8),0);
  nni_lmq_init((nni_lmq *)((long)arg + 0x48),0);
  nni_aio_list_init((nni_list *)((long)arg + 0xf0));
  nni_aio_list_init((nni_list *)((long)arg + 0x90));
  nni_pollable_init((nni_pollable *)((long)arg + 0x108));
  nni_pollable_init((nni_pollable *)((long)arg + 0x118));
  nni_atomic_init((nni_atomic_int *)((long)arg + 0x18));
  nni_atomic_set((nni_atomic_int *)((long)arg + 0x18),8);
  item = (nni_stat_item *)((long)arg + 0x130);
  nni_stat_init(item,&pair1_sock_init_impl::poly_info);
  nni_sock_add_stat(*arg,item);
  item_00 = (nni_stat_item *)((long)arg + 0x170);
  nni_stat_init(item_00,&pair1_sock_init_impl::raw_info);
  nni_sock_add_stat(*arg,item_00);
  nni_stat_init((nni_stat_item *)((long)arg + 0x1b0),&pair1_sock_init_impl::mismatch_info);
  nni_sock_add_stat(*arg,(nni_stat_item *)((long)arg + 0x1b0));
  nni_stat_init((nni_stat_item *)((long)arg + 0x1f0),&pair1_sock_init_impl::already_info);
  nni_sock_add_stat(*arg,(nni_stat_item *)((long)arg + 0x1f0));
  nni_stat_init((nni_stat_item *)((long)arg + 0x230),&pair1_sock_init_impl::ttl_drop_info);
  nni_sock_add_stat(*arg,(nni_stat_item *)((long)arg + 0x230));
  nni_stat_init((nni_stat_item *)((long)arg + 0x2f0),&pair1_sock_init_impl::tx_drop_info);
  nni_sock_add_stat(*arg,(nni_stat_item *)((long)arg + 0x2f0));
  nni_stat_init((nni_stat_item *)((long)arg + 0x270),&pair1_sock_init_impl::rx_malformed_info);
  nni_sock_add_stat(*arg,(nni_stat_item *)((long)arg + 0x270));
  if (CONCAT31(in_register_00000011,raw) != 0) {
    nni_stat_init((nni_stat_item *)((long)arg + 0x2b0),&pair1_sock_init_impl::tx_malformed_info);
    nni_sock_add_stat(*arg,(nni_stat_item *)((long)arg + 0x2b0));
  }
  nni_stat_set_bool(item_00,raw);
  nni_stat_set_bool(item,false);
  return;
}

Assistant:

static void
pair1_sock_init_impl(void *arg, nni_sock *sock, bool raw)
{
	pair1_sock *s = arg;

	// Raw mode uses this.
	nni_mtx_init(&s->mtx);
	s->sock = sock;
	s->raw  = raw;

	nni_lmq_init(&s->rmq, 0);
	nni_lmq_init(&s->wmq, 0);
	nni_aio_list_init(&s->raq);
	nni_aio_list_init(&s->waq);
	nni_pollable_init(&s->writable);
	nni_pollable_init(&s->readable);
	nni_atomic_init(&s->ttl);
	nni_atomic_set(&s->ttl, 8);

#ifdef NNG_ENABLE_STATS
	static const nni_stat_info poly_info = {
		.si_name = "poly",
		.si_desc = "polyamorous mode?",
		.si_type = NNG_STAT_BOOLEAN,
	};
	static const nni_stat_info raw_info = {
		.si_name = "raw",
		.si_desc = "raw mode?",
		.si_type = NNG_STAT_BOOLEAN,
	};
	static const nni_stat_info mismatch_info = {
		.si_name   = "mismatch",
		.si_desc   = "pipes rejected (protocol mismatch)",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info already_info = {
		.si_name   = "already",
		.si_desc   = "pipes rejected (already connected)",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info ttl_drop_info = {
		.si_name   = "ttl_drop",
		.si_desc   = "messages dropped due to too many hops",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info tx_drop_info = {
		.si_name   = "tx_drop",
		.si_desc   = "messages dropped undeliverable",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info rx_malformed_info = {
		.si_name   = "rx_malformed",
		.si_desc   = "malformed messages received",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info tx_malformed_info = {
		.si_name   = "tx_malformed",
		.si_desc   = "malformed messages not sent",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};

	pair1_add_sock_stat(s, &s->stat_poly, &poly_info);
	pair1_add_sock_stat(s, &s->stat_raw, &raw_info);
	pair1_add_sock_stat(s, &s->stat_reject_mismatch, &mismatch_info);
	pair1_add_sock_stat(s, &s->stat_reject_already, &already_info);
	pair1_add_sock_stat(s, &s->stat_ttl_drop, &ttl_drop_info);
	pair1_add_sock_stat(s, &s->stat_tx_drop, &tx_drop_info);
	pair1_add_sock_stat(s, &s->stat_rx_malformed, &rx_malformed_info);

	if (raw) {
		// This stat only makes sense in raw mode.
		pair1_add_sock_stat(
		    s, &s->stat_tx_malformed, &tx_malformed_info);
	}

	nni_stat_set_bool(&s->stat_raw, raw);
	nni_stat_set_bool(&s->stat_poly, false);
#endif
}